

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineMultisampleStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineMultisampleStateCreateInfo>
          (Impl *this,VkPipelineMultisampleStateCreateInfo *src,size_t count,ScratchAllocator *alloc
          )

{
  VkPipelineMultisampleStateCreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineMultisampleStateCreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipelineMultisampleStateCreateInfo>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkPipelineMultisampleStateCreateInfo_const*,VkPipelineMultisampleStateCreateInfo*>
                (src,src + count,(VkPipelineMultisampleStateCreateInfo *)this_local);
    }
  }
  return (VkPipelineMultisampleStateCreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}